

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_boom_zone(FILE *file,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,REF_DBL *center,
                 REF_DBL aoa,REF_DBL phi,REF_DBL h)

{
  uint uVar1;
  REF_INT *sorted_index;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *order;
  REF_INT *pRStack_118;
  REF_INT i;
  REF_INT *source;
  int local_108;
  REF_INT n;
  REF_INT local_n;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_DBL *t;
  REF_DBL *xyzf;
  REF_DBL *local_xyzf;
  REF_DBL *ray_field;
  REF_GRID ray_grid;
  REF_DBL dt [3];
  double local_a8;
  REF_DBL ds [3];
  REF_DBL local_88;
  REF_DBL segment1 [3];
  REF_DBL local_68;
  REF_DBL segment0 [3];
  REF_DBL h_local;
  REF_DBL phi_local;
  REF_DBL aoa_local;
  REF_DBL *center_local;
  REF_INT ldim_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  FILE *file_local;
  
  _local_n = ref_grid->mpi;
  segment0[2] = h;
  file_local._4_4_ = ref_iso_segment(ref_grid,center,aoa,phi,h,&local_68,&local_88);
  if (file_local._4_4_ == 0) {
    for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
      ds[(long)order._4_4_ + -1] =
           segment1[(long)order._4_4_ + -1] - segment0[(long)order._4_4_ + -1];
    }
    file_local._4_4_ = ref_math_normalize(&local_a8);
    if (file_local._4_4_ == 0) {
      file_local._4_4_ =
           ref_iso_cast((REF_GRID *)&ray_field,&local_xyzf,ref_grid,field,ldim,&local_68,&local_88);
      if (file_local._4_4_ == 0) {
        ref_mpi = (REF_MPI)ray_field[1];
        local_108 = 0;
        for (n = 0; n < ref_mpi->id; n = n + 1) {
          if ((((-1 < n) && (n < ref_mpi->id)) &&
              (-1 < *(long *)((long)ref_mpi->comm + (long)n * 8))) &&
             (*(int *)((long)ref_mpi[1].start_time + 4) ==
              *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)n * 4))) {
            local_108 = local_108 + 1;
          }
        }
        if (local_108 * (ldim + 3) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x344,"ref_iso_boom_zone","malloc local_xyzf of REF_DBL negative");
          file_local._4_4_ = 1;
        }
        else {
          xyzf = (REF_DBL *)malloc((long)(local_108 * (ldim + 3)) << 3);
          if (xyzf == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x344,"ref_iso_boom_zone","malloc local_xyzf of REF_DBL NULL");
            file_local._4_4_ = 2;
          }
          else {
            local_108 = 0;
            for (n = 0; n < ref_mpi->id; n = n + 1) {
              if (((-1 < n) && (n < ref_mpi->id)) &&
                 ((-1 < *(long *)((long)ref_mpi->comm + (long)n * 8) &&
                  (*(int *)((long)ref_mpi[1].start_time + 4) ==
                   *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)n * 4))))) {
                for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
                  xyzf[order._4_4_ + (ldim + 3) * local_108] =
                       *(REF_DBL *)(*(long *)(ref_mpi + 1) + (long)(order._4_4_ + n * 0xf) * 8);
                }
                for (order._4_4_ = 0; order._4_4_ < ldim; order._4_4_ = order._4_4_ + 1) {
                  xyzf[order._4_4_ + 3 + (ldim + 3) * local_108] =
                       local_xyzf[order._4_4_ + n * ldim];
                }
                local_108 = local_108 + 1;
              }
            }
            if (local_xyzf != (REF_DBL *)0x0) {
              free(local_xyzf);
            }
            ref_grid_free((REF_GRID)ray_field);
            file_local._4_4_ =
                 ref_mpi_allconcat(_local_n,ldim + 3,local_108,xyzf,(REF_INT *)((long)&source + 4),
                                   &stack0xfffffffffffffee8,&t,3);
            if (file_local._4_4_ == 0) {
              if (xyzf != (REF_DBL *)0x0) {
                free(xyzf);
              }
              if (_local_n->id == 0) {
                if (pRStack_118 != (REF_INT *)0x0) {
                  free(pRStack_118);
                }
                if (source._4_4_ < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x358,"ref_iso_boom_zone","malloc t of REF_DBL negative");
                  return 1;
                }
                ref_node = (REF_NODE)malloc((long)source._4_4_ << 3);
                if (ref_node == (REF_NODE)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x358,"ref_iso_boom_zone","malloc t of REF_DBL NULL");
                  return 2;
                }
                for (n = 0; n < source._4_4_; n = n + 1) {
                  for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
                    dt[(long)order._4_4_ + -1] =
                         t[order._4_4_ + (ldim + 3) * n] - segment0[(long)order._4_4_ + -1];
                  }
                  *(double *)(&ref_node->n + (long)n * 2) =
                       dt[1] * ds[1] + (double)ray_grid * local_a8 + dt[0] * ds[0];
                }
                if (source._4_4_ < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x35e,"ref_iso_boom_zone","malloc order of REF_INT negative");
                  return 1;
                }
                sorted_index = (REF_INT *)malloc((long)source._4_4_ << 2);
                if (sorted_index == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x35e,"ref_iso_boom_zone","malloc order of REF_INT NULL");
                  return 2;
                }
                uVar1 = ref_sort_heap_dbl(source._4_4_,(REF_DBL *)ref_node,sorted_index);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x35f,"ref_iso_boom_zone",(ulong)uVar1,"sort t");
                  return uVar1;
                }
                fprintf((FILE *)file," zone t=\"PHI=%.1f,R=%.1f\"\n",phi,segment0[2]);
                for (n = 0; n < source._4_4_; n = n + 1) {
                  for (order._4_4_ = 0; order._4_4_ < ldim + 3; order._4_4_ = order._4_4_ + 1) {
                    fprintf((FILE *)file," %.15e",t[order._4_4_ + (ldim + 3) * sorted_index[n]]);
                  }
                  fprintf((FILE *)file,"\n");
                }
                if (sorted_index != (REF_INT *)0x0) {
                  free(sorted_index);
                }
                if (ref_node != (REF_NODE)0x0) {
                  free(ref_node);
                }
                if (t != (REF_DBL *)0x0) {
                  free(t);
                }
              }
              file_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x354,"ref_iso_boom_zone",(ulong)file_local._4_4_,"concat");
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x33c
               ,"ref_iso_boom_zone",(ulong)file_local._4_4_,"cast");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x338,
             "ref_iso_boom_zone",(ulong)file_local._4_4_,"segment unit vector");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x336,
           "ref_iso_boom_zone",(ulong)file_local._4_4_,"seg");
  }
  return file_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_zone(FILE *file, REF_GRID ref_grid,
                                     REF_DBL *field, REF_INT ldim,
                                     REF_DBL *center, REF_DBL aoa, REF_DBL phi,
                                     REF_DBL h) {
  REF_DBL segment0[3], segment1[3], ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;

  RSS(ref_iso_segment(ref_grid, center, aoa, phi, h, segment0, segment1),
      "seg");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"PHI=%.1f,R=%.1f\"\n", phi, h);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }

  return REF_SUCCESS;
}